

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O2

int32_t getDataBlock(UNewTrie2 *trie,UChar32 c,UBool forLSCP)

{
  uint uVar1;
  int32_t iVar2;
  long lVar3;
  uint32_t *puVar4;
  int iVar5;
  long lVar6;
  uint32_t *puVar7;
  int block;
  int iVar8;
  uint i2;
  byte bVar9;
  
  bVar9 = 0;
  iVar2 = getIndex2Block(trie,c,forLSCP);
  iVar8 = -1;
  if (-1 < iVar2) {
    i2 = iVar2 + ((uint)c >> 5 & 0x3f);
    iVar8 = trie->index2[i2];
    if ((trie->dataNullOffset == iVar8) || (trie->map[iVar8 >> 5] != 1)) {
      block = trie->firstFreeBlock;
      if (block == 0) {
        uVar1 = trie->dataCapacity;
        block = trie->dataLength;
        if ((int)uVar1 < block + 0x20) {
          iVar5 = 0x20000;
          if ((0x1ffff < (int)uVar1) && (iVar5 = 0x110480, 0x11047f < uVar1)) {
            return -1;
          }
          puVar4 = (uint32_t *)uprv_malloc_63((ulong)(uint)(iVar5 * 4));
          if (puVar4 == (uint32_t *)0x0) {
            return -1;
          }
          puVar7 = trie->data;
          memcpy(puVar4,puVar7,(long)trie->dataLength << 2);
          uprv_free_63(puVar7);
          trie->data = puVar4;
          trie->dataCapacity = iVar5;
        }
        trie->dataLength = block + 0x20;
        lVar3 = (long)(block >> 5);
      }
      else {
        lVar3 = (long)(block >> 5);
        trie->firstFreeBlock = -trie->map[lVar3];
      }
      puVar4 = trie->data + iVar8;
      puVar7 = trie->data + block;
      for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar7 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar9 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      trie->map[lVar3] = 0;
      iVar8 = -1;
      if (-1 < block) {
        setIndex2Entry(trie,i2,block);
        iVar8 = block;
      }
    }
  }
  return iVar8;
}

Assistant:

static int32_t
getDataBlock(UNewTrie2 *trie, UChar32 c, UBool forLSCP) {
    int32_t i2, oldBlock, newBlock;

    i2=getIndex2Block(trie, c, forLSCP);
    if(i2<0) {
        return -1;  /* program error */
    }

    i2+=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
    oldBlock=trie->index2[i2];
    if(isWritableBlock(trie, oldBlock)) {
        return oldBlock;
    }

    /* allocate a new data block */
    newBlock=allocDataBlock(trie, oldBlock);
    if(newBlock<0) {
        /* out of memory in the data array */
        return -1;
    }
    setIndex2Entry(trie, i2, newBlock);
    return newBlock;
}